

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  undefined1 local_60 [8];
  printbuffer p;
  cJSON_bool fmt_local;
  int prebuffer_local;
  cJSON *item_local;
  
  p.hooks.reallocate._0_4_ = fmt;
  p.hooks.reallocate._4_4_ = prebuffer;
  memset(local_60,0,0x40);
  if (p.hooks.reallocate._4_4_ < 0) {
    item_local = (cJSON *)0x0;
  }
  else {
    local_60 = (undefined1  [8])(*global_hooks.allocate)((long)p.hooks.reallocate._4_4_);
    if (local_60 == (undefined1  [8])0x0) {
      item_local = (cJSON *)0x0;
    }
    else {
      p.buffer = (uchar *)(long)p.hooks.reallocate._4_4_;
      p.length = 0;
      p.depth._0_4_ = 0;
      p.depth._4_4_ = (cJSON_bool)p.hooks.reallocate;
      p._32_8_ = global_hooks.allocate;
      p.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
      p.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
      cVar1 = print_value(item,(printbuffer *)local_60);
      if (cVar1 == 0) {
        (*global_hooks.deallocate)((void *)local_60);
        item_local = (cJSON *)0x0;
      }
      else {
        item_local = (cJSON *)local_60;
      }
    }
  }
  return (char *)item_local;
}

Assistant:

CJSON_PUBLIC(char *) cJSON_PrintBuffered(const cJSON *item, int prebuffer, cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if (prebuffer < 0)
    {
        return NULL;
    }

    p.buffer = (unsigned char*)global_hooks.allocate((size_t)prebuffer);
    if (!p.buffer)
    {
        return NULL;
    }

    p.length = (size_t)prebuffer;
    p.offset = 0;
    p.noalloc = false;
    p.format = fmt;
    p.hooks = global_hooks;

    if (!print_value(item, &p))
    {
        global_hooks.deallocate(p.buffer);
        return NULL;
    }

    return (char*)p.buffer;
}